

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::WATParser::Limits> *
wasm::WATParser::limits32<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::WATParser::Limits> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  optional<unsigned_int> oVar1;
  bool bVar2;
  uint *puVar3;
  optional<unsigned_long> m_00;
  Limits local_a8;
  _Optional_payload_base<unsigned_int> local_90;
  _Storage<unsigned_long,_true> local_88;
  optional<unsigned_long> m;
  allocator<char> local_61;
  string local_60;
  Err local_40;
  _Optional_payload_base<unsigned_int> local_20;
  optional<unsigned_int> n;
  ParseDeclsCtx *ctx_local;
  
  n.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_base<unsigned_int,_true,_true>)(_Optional_base<unsigned_int,_true,_true>)ctx;
  local_20 = (_Optional_payload_base<unsigned_int>)Lexer::takeU32(&ctx->in);
  bVar2 = std::optional::operator_cast_to_bool((optional *)&local_20);
  oVar1 = n;
  if (bVar2) {
    local_90 = (_Optional_payload_base<unsigned_int>)
               Lexer::takeU32((Lexer *)n.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                       super__Optional_payload_base<unsigned_int>);
    std::optional<unsigned_long>::optional<unsigned_int,_true>
              ((optional<unsigned_long> *)&local_88,(optional<unsigned_int> *)&local_90);
    oVar1 = n;
    puVar3 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_20);
    m_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged =
         (bool)m.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_;
    m_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_88._M_value;
    m_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._9_7_ = 0;
    ParseDeclsCtx::makeLimits
              (&local_a8,
               (ParseDeclsCtx *)
               oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>,(ulong)*puVar3,m_00);
    Result<wasm::WATParser::Limits>::Result<wasm::WATParser::Limits>
              (__return_storage_ptr__,&local_a8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"expected initial size",&local_61);
    Lexer::err(&local_40,
               (Lexer *)oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_int>,&local_60);
    Result<wasm::WATParser::Limits>::Result(__return_storage_ptr__,&local_40);
    wasm::Err::~Err(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::LimitsT> limits32(Ctx& ctx) {
  auto n = ctx.in.takeU32();
  if (!n) {
    return ctx.in.err("expected initial size");
  }
  std::optional<uint64_t> m = ctx.in.takeU32();
  return ctx.makeLimits(uint64_t(*n), m);
}